

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.c
# Opt level: O3

void destroyOption(char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  
  if (name == (char *)0x0 || value == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar3 = "invalid argument (name=%p, value=%p)";
    iVar1 = 0x145;
  }
  else {
    iVar1 = strcmp("SAVED_OPTION_MAX_ENQUEUE_TIME_SECS",name);
    if (((iVar1 == 0) || (iVar1 = strcmp("SAVED_OPTION_MAX_PROCESSING_TIME_SECS",name), iVar1 == 0))
       || (iVar1 = strcmp("SAVED_OPTION_MAX_RETRY_COUNT",name), iVar1 == 0)) {
      free(value);
      return;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar3 = "option %s is invalid";
    iVar1 = 0x14f;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
            ,"destroyOption",iVar1,1,pcVar3,name);
  return;
}

Assistant:

static void destroyOption(const char* name, const void* value)
{
    if (name == NULL || value == NULL)
    {
        LogError("invalid argument (name=%p, value=%p)", name, value);
    }
    else if (strcmp(SAVED_OPTION_MAX_ENQUEUE_TIME_SECS, name) == 0 ||
        strcmp(SAVED_OPTION_MAX_PROCESSING_TIME_SECS, name) == 0 ||
        strcmp(SAVED_OPTION_MAX_RETRY_COUNT, name) == 0)
    {
        free((void*)value);
    }
    else
    {
        LogError("option %s is invalid", name);
    }
}